

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_DataBlock(VGMPlayer *this)

{
  UINT32 *pUVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT32 memSize;
  iterator iVar4;
  byte chipID;
  void *pvVar5;
  uint uVar6;
  CHIP_DEVICE *pCVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  PCM_BANK *this_00;
  UINT32 *data;
  uint inLen;
  UINT8 *pUVar12;
  UINT32 oldLen;
  PCM_CDB_INF dbCI;
  uint local_54;
  uint local_50;
  UINT32 local_4c;
  PCM_CDB_INF local_48;
  
  pUVar12 = this->_fileData;
  uVar6 = this->_filePos;
  bVar2 = pUVar12[(ulong)uVar6 + 2];
  uVar8 = (uint)bVar2;
  chipID = pUVar12[(ulong)uVar6 + 6] >> 7;
  inLen = (pUVar12[(ulong)uVar6 + 6] & 0x7f) << 0x18 | (uint)pUVar12[(ulong)uVar6 + 5] << 0x10 |
          (uint)*(ushort *)(pUVar12 + (ulong)uVar6 + 3);
  uVar6 = uVar6 + 7;
  this->_filePos = uVar6;
  if (bVar2 >> 6 < 2) {
    if (uVar8 == 0x7f) {
      ReadPCMComprTable(inLen,pUVar12 + uVar6,&this->_pcmComprTbl);
    }
    else {
      uVar8 = uVar8 & 0x3f;
      this_00 = this->_pcmBank + uVar8;
      local_50 = *(int *)&this->_pcmBank[uVar8].data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this_00->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
      pUVar12 = pUVar12 + uVar6;
      local_54 = inLen;
      if ((bVar2 & 0x40) == 0) {
        iVar4._M_current =
             this->_pcmBank[uVar8].bankOfs.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankOfs.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankOfs,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = local_50;
          this->_pcmBank[uVar8].bankOfs.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             this->_pcmBank[uVar8].bankSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankSize.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankSize,iVar4,&local_54);
        }
        else {
          *iVar4._M_current = local_54;
          this->_pcmBank[uVar8].bankSize.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_54 + local_50));
        memcpy((this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + local_50,pUVar12,(ulong)local_54);
      }
      else {
        ReadComprDataBlkHdr(inLen,pUVar12,&local_48);
        local_48.cmprInfo.comprTbl = &this->_pcmComprTbl;
        local_54 = local_48.decmpLen;
        iVar4._M_current =
             this->_pcmBank[uVar8].bankOfs.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankOfs.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankOfs,iVar4,&local_50);
        }
        else {
          *iVar4._M_current = local_50;
          this->_pcmBank[uVar8].bankOfs.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             this->_pcmBank[uVar8].bankSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankSize.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankSize,iVar4,&local_54);
        }
        else {
          *iVar4._M_current = local_54;
          this->_pcmBank[uVar8].bankSize.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_54 + local_50));
        DecompressDataBlk(local_54,(this_00->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_50,
                          inLen - local_48.hdrSize,pUVar12 + local_48.hdrSize,&local_48.cmprInfo);
      }
    }
    goto LAB_0012325c;
  }
  if (bVar2 >> 6 == 2) {
    uVar8 = uVar8 & 0x3f;
    UVar3 = _VGM_ROM_CHIPS[uVar8][0];
    pCVar7 = GetDevicePtr(this,UVar3,chipID);
    if (pCVar7 != (CHIP_DEVICE *)0x0) {
      pUVar1 = (UINT32 *)(this->_fileData + this->_filePos);
      data = pUVar1 + 2;
      memSize = *pUVar1;
      local_4c = pUVar1[1];
      local_54 = inLen - 8;
      if (((UVar3 == '\x1c') && (local_54 != 0)) && ((pCVar7->flags & 1) != 0)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                   (ulong)local_54,(allocator_type *)&local_50);
        if (local_54 != 0) {
          uVar6 = 0;
          do {
            *(undefined1 *)(CONCAT44(local_48.decmpLen,local_48.hdrSize) + (ulong)uVar6) =
                 *(undefined1 *)((long)data + (ulong)(uVar6 + 1));
            *(undefined1 *)(CONCAT44(local_48.decmpLen,local_48.hdrSize) + (ulong)(uVar6 + 1)) =
                 *(undefined1 *)((long)data + (ulong)uVar6);
            uVar6 = uVar6 + 2;
          } while (uVar6 < local_54);
        }
        WriteChipROM(pCVar7,_VGM_ROM_CHIPS[uVar8][1],memSize,local_4c,local_54,
                     (UINT8 *)CONCAT44(local_48.decmpLen,local_48.hdrSize));
        pvVar5 = (void *)CONCAT44(local_48.decmpLen,local_48.hdrSize);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,(long)local_48.cmprInfo.comprTbl - (long)pvVar5);
        }
      }
      else {
        WriteChipROM(pCVar7,_VGM_ROM_CHIPS[uVar8][1],memSize,local_4c,local_54,(UINT8 *)data);
      }
    }
    goto LAB_0012325c;
  }
  UVar3 = _VGM_RAM_CHIPS[bVar2 & 0x3f];
  pCVar7 = GetDevicePtr(this,UVar3,chipID);
  if ((pCVar7 == (CHIP_DEVICE *)0x0) || (pCVar7->romWrite == (DEVFUNC_WRITE_BLOCK)0x0))
  goto LAB_0012325c;
  puVar9 = (uint *)(this->_fileData + this->_filePos);
  if ((bVar2 & 0x20) == 0) {
    uVar6 = (uint)(ushort)*puVar9;
    local_54 = inLen - 2;
    lVar11 = 2;
  }
  else {
    uVar6 = *puVar9;
    local_54 = inLen - 4;
    lVar11 = 4;
  }
  if (UVar3 == '\x05') {
    lVar10 = 0x355c;
LAB_00123245:
    uVar6 = uVar6 | (uint)*(byte *)((long)&(this->super_PlayerBase)._vptr_PlayerBase +
                                   (ulong)chipID + lVar10) << 0xc;
  }
  else if (UVar3 == '\x10') {
    lVar10 = 0x355e;
    goto LAB_00123245;
  }
  (*pCVar7->romWrite)((pCVar7->base).defInf.dataPtr,uVar6,local_54,(UINT8 *)((long)puVar9 + lVar11))
  ;
LAB_0012325c:
  this->_filePos = this->_filePos + inLen;
  return;
}

Assistant:

void VGMPlayer::Cmd_DataBlock(void)
{
	UINT8 dblkType;
	UINT8 chipType;
	UINT8 chipID;
	UINT32 dblkLen;
	UINT32 memSize;
	UINT32 dataOfs;
	UINT32 dataLen;
	const UINT8* dataPtr;
	CHIP_DEVICE* cDev;
	
	dblkType = fData[0x02];
	dblkLen = ReadLE32(&fData[0x03]);
	chipID = (dblkLen & 0x80000000) >> 31;
	dblkLen &= 0x7FFFFFFF;
	_filePos += 0x07;
	
	switch(dblkType & 0xC0)
	{
	case 0x00:	// uncompressed data block
	case 0x40:	// compressed data block
		if (dblkType == 0x7F)
		{
			ReadPCMComprTable(dblkLen, &fData[0x00], &_pcmComprTbl);
		}
		else
		{
			PCM_BANK* pcmBnk = &_pcmBank[dblkType & 0x3F];
			PCM_CDB_INF dbCI;
			UINT32 oldLen = (UINT32)pcmBnk->data.size();
			dataLen = dblkLen;
			dataPtr = &fData[0x00];
			
			if (dblkType & 0x40)
			{
				ReadComprDataBlkHdr(dblkLen, dataPtr, &dbCI);
				dbCI.cmprInfo.comprTbl = &_pcmComprTbl;
				dataLen = dbCI.decmpLen;
			}
			
			pcmBnk->bankOfs.push_back(oldLen);
			pcmBnk->bankSize.push_back(dataLen);
			
			pcmBnk->data.resize(oldLen + dataLen);
			if (dblkType & 0x40)
			{
				DecompressDataBlk(dataLen, &pcmBnk->data[oldLen],
									dblkLen - dbCI.hdrSize, &dataPtr[dbCI.hdrSize], &dbCI.cmprInfo);
			}
			else
			{
				memcpy(&pcmBnk->data[oldLen], dataPtr, dataLen);
			}
			
			// TODO: refresh DAC Stream pointers
		}
		break;
	case 0x80:	// ROM/RAM write
		chipType = _VGM_ROM_CHIPS[dblkType & 0x3F][0];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL)
			break;
		
		memSize = ReadLE32(&fData[0x00]);
		dataOfs = ReadLE32(&fData[0x04]);
		dataPtr = &fData[0x08];
		dataLen = dblkLen - 0x08;
		if (chipType == 0x1C && dataLen && (cDev->flags & 0x01))
		{
			// chip == ASIC 219 (ID 0x1C + flags 0x01): byte-swap sample data
			std::vector<UINT8> swpData(dataLen);
			for (UINT32 curPos = 0x00; curPos < dataLen; curPos += 0x02)
			{
				swpData[curPos + 0x00] = dataPtr[curPos + 0x01];
				swpData[curPos + 0x01] = dataPtr[curPos + 0x00];
			}
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, &swpData[0x00]);
		}
		else
		{
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, dataPtr);
		}
		break;
	case 0xC0:	// RAM Write
		chipType = _VGM_RAM_CHIPS[dblkType & 0x3F];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL || cDev->romWrite == NULL)
			break;
		
		if (! (dblkType & 0x20))
		{
			// C0..DF: 16-bit addressing
			dataOfs = ReadLE16(&fData[0x00]);
			dataLen = dblkLen - 0x02;
			dataPtr = &fData[0x02];
		}
		else
		{
			// E0..FF: 32-bit addressing
			dataOfs = ReadLE32(&fData[0x00]);
			dataLen = dblkLen - 0x04;
			dataPtr = &fData[0x04];
		}
		DoRAMOfsPatches(chipType, chipID, dataOfs, dataLen);
		cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, dataPtr);
		break;
	}
	
	_filePos += dblkLen;
	return;
}